

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_inward_boundary_orientation(REF_GRID ref_grid)

{
  bool bVar1;
  REF_STATUS RVar2;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT group;
  REF_INT face;
  REF_BOOL flip;
  REF_INT nodes [27];
  REF_BOOL local_54;
  REF_INT face_nodes [4];
  uint local_40;
  uint local_3c;
  REF_INT node;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_CELL qua;
  REF_CELL tri;
  REF_GRID ref_grid_local;
  
  qua = ref_grid->cell[3];
  ref_cell = ref_grid->cell[6];
  cell1 = 0;
  tri = (REF_CELL)ref_grid;
  do {
    if (qua->max <= cell1) {
      cell1 = 0;
      do {
        if (ref_cell->max <= cell1) {
          return 0;
        }
        RVar2 = ref_cell_nodes(ref_cell,cell1,&face);
        if (RVar2 == 0) {
          for (local_40 = 0; (int)local_40 < 4; local_40 = local_40 + 1) {
            nodes[(long)(int)local_40 + 0x1a] = (&face)[(int)local_40];
          }
          bVar1 = false;
          ref_private_status_reis_ai._4_4_ = 8;
          _cell0 = *(REF_CELL *)&tri[1].size_per;
          while ((int)ref_private_status_reis_ai._4_4_ < 0x10) {
            uVar3 = ref_cell_with_face(_cell0,nodes + 0x1a,&node,(REF_INT *)&local_3c);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x2de,"ref_grid_inward_boundary_orientation",(ulong)uVar3,"wf");
              return uVar3;
            }
            if (node != -1) {
              if ((long)(int)local_3c != -1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0x2e0,"ref_grid_inward_boundary_orientation","boundary quad with two cells",
                       0xffffffffffffffff,(long)(int)local_3c);
                return 1;
              }
              for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < _cell0->face_per;
                  ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                if ((_cell0->c2n
                     [_cell0->f2n[ref_private_macro_code_rss << 2] + _cell0->size_per * node] !=
                     _cell0->c2n
                     [_cell0->f2n[ref_private_macro_code_rss * 4 + 3] + _cell0->size_per * node]) &&
                   (((((face == _cell0->c2n
                                [_cell0->f2n[ref_private_macro_code_rss * 4 + 3] +
                                 _cell0->size_per * node] &&
                       (flip == _cell0->c2n
                                [_cell0->f2n[ref_private_macro_code_rss * 4 + 2] +
                                 _cell0->size_per * node])) &&
                      (nodes[0] ==
                       _cell0->c2n
                       [_cell0->f2n[ref_private_macro_code_rss * 4 + 1] + _cell0->size_per * node]))
                     && (nodes[1] ==
                         _cell0->c2n
                         [_cell0->f2n[ref_private_macro_code_rss << 2] + _cell0->size_per * node]))
                    || ((((face == _cell0->c2n
                                   [_cell0->f2n[ref_private_macro_code_rss * 4 + 2] +
                                    _cell0->size_per * node] &&
                          (flip == _cell0->c2n
                                   [_cell0->f2n[ref_private_macro_code_rss * 4 + 1] +
                                    _cell0->size_per * node])) &&
                         ((nodes[0] ==
                           _cell0->c2n
                           [_cell0->f2n[ref_private_macro_code_rss << 2] + _cell0->size_per * node]
                          && (nodes[1] ==
                              _cell0->c2n
                              [_cell0->f2n[ref_private_macro_code_rss * 4 + 3] +
                               _cell0->size_per * node])))) ||
                        (((((face == _cell0->c2n
                                     [_cell0->f2n[ref_private_macro_code_rss * 4 + 1] +
                                      _cell0->size_per * node] &&
                            (flip == _cell0->c2n
                                     [_cell0->f2n[ref_private_macro_code_rss << 2] +
                                      _cell0->size_per * node])) &&
                           (nodes[0] ==
                            _cell0->c2n
                            [_cell0->f2n[ref_private_macro_code_rss * 4 + 3] +
                             _cell0->size_per * node])) &&
                          (nodes[1] ==
                           _cell0->c2n
                           [_cell0->f2n[ref_private_macro_code_rss * 4 + 2] +
                            _cell0->size_per * node])) ||
                         ((((face == _cell0->c2n
                                     [_cell0->f2n[ref_private_macro_code_rss << 2] +
                                      _cell0->size_per * node] &&
                            (flip == _cell0->c2n
                                     [_cell0->f2n[ref_private_macro_code_rss * 4 + 3] +
                                      _cell0->size_per * node])) &&
                           (nodes[0] ==
                            _cell0->c2n
                            [_cell0->f2n[ref_private_macro_code_rss * 4 + 2] +
                             _cell0->size_per * node])) &&
                          (nodes[1] ==
                           _cell0->c2n
                           [_cell0->f2n[ref_private_macro_code_rss * 4 + 1] +
                            _cell0->size_per * node])))))))))) {
                  if (bVar1) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                           ,0x2f5,"ref_grid_inward_boundary_orientation","error, flip set twice");
                    return 1;
                  }
                  bVar1 = true;
                }
              }
            }
            ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1;
            _cell0 = *(REF_CELL *)(&tri->edge_per + (long)(int)ref_private_status_reis_ai._4_4_ * 2)
            ;
          }
          if (bVar1) {
            face = face_nodes[1];
            flip = face_nodes[0];
            nodes[0] = local_54;
            nodes[1] = nodes[0x1a];
            uVar3 = ref_cell_replace_whole(ref_cell,cell1,&face);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x2ff,"ref_grid_inward_boundary_orientation",(ulong)uVar3,"replace with flip")
              ;
              return uVar3;
            }
          }
        }
        cell1 = cell1 + 1;
      } while( true );
    }
    RVar2 = ref_cell_nodes(qua,cell1,&face);
    if (RVar2 == 0) {
      for (local_40 = 0; (int)local_40 < 3; local_40 = local_40 + 1) {
        nodes[(long)(int)local_40 + 0x1a] = (&face)[(int)local_40];
      }
      face_nodes[1] = nodes[0x1a];
      bVar1 = false;
      ref_private_status_reis_ai._4_4_ = 8;
      _cell0 = *(REF_CELL *)&tri[1].size_per;
      while ((int)ref_private_status_reis_ai._4_4_ < 0x10) {
        uVar3 = ref_cell_with_face(_cell0,nodes + 0x1a,&node,(REF_INT *)&local_3c);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x2a0,"ref_grid_inward_boundary_orientation",(ulong)uVar3,"with face");
          return uVar3;
        }
        if (node != -1) {
          if (local_3c != 0xffffffff) {
            printf("group %d cell0 %d cell1 %d\n",(ulong)ref_private_status_reis_ai._4_4_,
                   (ulong)(uint)node,(ulong)local_3c);
            for (local_40 = 0; (int)local_40 < _cell0->node_per; local_40 = local_40 + 1) {
              printf("cell0 node %d xyz %f %f %f\n",
                     *(undefined8 *)
                      (*(long *)(*(long *)&tri->size_per + 0x38) +
                      (long)(_cell0->c2n[(int)(local_40 + _cell0->size_per * node)] * 0xf) * 8),
                     *(undefined8 *)
                      (*(long *)(*(long *)&tri->size_per + 0x38) +
                      (long)(_cell0->c2n[(int)(local_40 + _cell0->size_per * node)] * 0xf + 1) * 8),
                     *(undefined8 *)
                      (*(long *)(*(long *)&tri->size_per + 0x38) +
                      (long)(_cell0->c2n[(int)(local_40 + _cell0->size_per * node)] * 0xf + 2) * 8),
                     (ulong)local_40);
            }
            for (local_40 = 0; (int)local_40 < _cell0->node_per; local_40 = local_40 + 1) {
              printf("cell1 node %d xyz %f %f %f\n",
                     *(undefined8 *)
                      (*(long *)(*(long *)&tri->size_per + 0x38) +
                      (long)(_cell0->c2n[(int)(local_40 + _cell0->size_per * local_3c)] * 0xf) * 8),
                     *(undefined8 *)
                      (*(long *)(*(long *)&tri->size_per + 0x38) +
                      (long)(_cell0->c2n[(int)(local_40 + _cell0->size_per * local_3c)] * 0xf + 1) *
                      8),*(undefined8 *)
                          (*(long *)(*(long *)&tri->size_per + 0x38) +
                          (long)(_cell0->c2n[(int)(local_40 + _cell0->size_per * local_3c)] * 0xf +
                                2) * 8),(ulong)local_40);
            }
            for (local_40 = 0; (int)local_40 < 3; local_40 = local_40 + 1) {
              printf("face node %d xyz %f %f %f\n",
                     *(undefined8 *)
                      (*(long *)(*(long *)&tri->size_per + 0x38) +
                      (long)(nodes[(long)(int)local_40 + 0x1a] * 0xf) * 8),
                     *(undefined8 *)
                      (*(long *)(*(long *)&tri->size_per + 0x38) +
                      (long)(nodes[(long)(int)local_40 + 0x1a] * 0xf + 1) * 8),
                     *(undefined8 *)
                      (*(long *)(*(long *)&tri->size_per + 0x38) +
                      (long)(nodes[(long)(int)local_40 + 0x1a] * 0xf + 2) * 8),(ulong)local_40);
            }
            if ((long)(int)local_3c != -1) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x2be,"ref_grid_inward_boundary_orientation",
                     "boundary triangle with two cells",0xffffffffffffffff,(long)(int)local_3c);
              return 1;
            }
          }
          for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < _cell0->face_per;
              ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
            if ((_cell0->c2n[_cell0->f2n[ref_private_macro_code_rss << 2] + _cell0->size_per * node]
                 == _cell0->c2n
                    [_cell0->f2n[ref_private_macro_code_rss * 4 + 3] + _cell0->size_per * node]) &&
               ((((face == _cell0->c2n
                           [_cell0->f2n[ref_private_macro_code_rss * 4 + 1] +
                            _cell0->size_per * node] &&
                  (flip == _cell0->c2n
                           [_cell0->f2n[ref_private_macro_code_rss << 2] + _cell0->size_per * node])
                  ) && (nodes[0] ==
                        _cell0->c2n
                        [_cell0->f2n[ref_private_macro_code_rss * 4 + 2] + _cell0->size_per * node])
                 ) || ((((flip == _cell0->c2n
                                  [_cell0->f2n[ref_private_macro_code_rss * 4 + 1] +
                                   _cell0->size_per * node] &&
                         (nodes[0] ==
                          _cell0->c2n
                          [_cell0->f2n[ref_private_macro_code_rss << 2] + _cell0->size_per * node]))
                        && (face == _cell0->c2n
                                    [_cell0->f2n[ref_private_macro_code_rss * 4 + 2] +
                                     _cell0->size_per * node])) ||
                       (((nodes[0] ==
                          _cell0->c2n
                          [_cell0->f2n[ref_private_macro_code_rss * 4 + 1] + _cell0->size_per * node
                          ] && (face == _cell0->c2n
                                        [_cell0->f2n[ref_private_macro_code_rss << 2] +
                                         _cell0->size_per * node])) &&
                        (flip == _cell0->c2n
                                 [_cell0->f2n[ref_private_macro_code_rss * 4 + 2] +
                                  _cell0->size_per * node])))))))) {
              if (bVar1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0x2cd,"ref_grid_inward_boundary_orientation","error, flip set twice");
                return 1;
              }
              bVar1 = true;
            }
          }
        }
        ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1;
        _cell0 = *(REF_CELL *)(&tri->edge_per + (long)(int)ref_private_status_reis_ai._4_4_ * 2);
      }
      if (bVar1) {
        face = face_nodes[0];
        flip = local_54;
        nodes[0] = nodes[0x1a];
        uVar3 = ref_cell_replace_whole(qua,cell1,&face);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x2d6,"ref_grid_inward_boundary_orientation",(ulong)uVar3,"replace with flip");
          return uVar3;
        }
      }
    }
    cell1 = cell1 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_grid_inward_boundary_orientation(REF_GRID ref_grid) {
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL qua = ref_grid_qua(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, cell0, cell1;
  REF_INT node;
  REF_INT face_nodes[4];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL flip;
  REF_INT face, group;

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    for (node = 0; node < 3; node++) face_nodes[node] = nodes[node];
    face_nodes[3] = face_nodes[0];
    flip = REF_FALSE;
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1),
          "with face");
      if (REF_EMPTY == cell0) continue; /* this cell does not have the face */
      if (REF_EMPTY != cell1) {
        printf("group %d cell0 %d cell1 %d\n", group, cell0, cell1);
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          printf("cell0 node %d xyz %f %f %f\n", node,
                 ref_node_xyz(ref_grid_node(ref_grid), 0,
                              ref_cell_c2n(ref_cell, node, cell0)),
                 ref_node_xyz(ref_grid_node(ref_grid), 1,
                              ref_cell_c2n(ref_cell, node, cell0)),
                 ref_node_xyz(ref_grid_node(ref_grid), 2,
                              ref_cell_c2n(ref_cell, node, cell0)));
        }
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          printf("cell1 node %d xyz %f %f %f\n", node,
                 ref_node_xyz(ref_grid_node(ref_grid), 0,
                              ref_cell_c2n(ref_cell, node, cell1)),
                 ref_node_xyz(ref_grid_node(ref_grid), 1,
                              ref_cell_c2n(ref_cell, node, cell1)),
                 ref_node_xyz(ref_grid_node(ref_grid), 2,
                              ref_cell_c2n(ref_cell, node, cell1)));
        }
        for (node = 0; node < 3; node++) {
          printf("face node %d xyz %f %f %f\n", node,
                 ref_node_xyz(ref_grid_node(ref_grid), 0, face_nodes[node]),
                 ref_node_xyz(ref_grid_node(ref_grid), 1, face_nodes[node]),
                 ref_node_xyz(ref_grid_node(ref_grid), 2, face_nodes[node]));
        }
        /* RSS( ref_export_by_extension( ref_grid,
           "bc-flip-debug.tec" ), "ex tec"); */
        REIS(REF_EMPTY, cell1, "boundary triangle with two cells");
      }
      each_ref_cell_cell_face(ref_cell, face) {
        if (ref_cell_f2n(ref_cell, 0, face, cell0) !=
            ref_cell_f2n(ref_cell, 3, face, cell0))
          continue; /* skip quad faces */
        if ((nodes[0] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 2, face, cell0)) ||
            (nodes[1] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[0] == ref_cell_f2n(ref_cell, 2, face, cell0)) ||
            (nodes[2] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[0] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 2, face, cell0))) {
          RAS(!flip, "error, flip set twice");
          flip = REF_TRUE;
        }
      }
    }
    if (flip) {
      nodes[0] = face_nodes[2];
      nodes[1] = face_nodes[1];
      nodes[2] = face_nodes[0];
      RSS(ref_cell_replace_whole(tri, cell, nodes), "replace with flip");
    }
  }

  each_ref_cell_valid_cell_with_nodes(qua, cell, nodes) {
    for (node = 0; node < 4; node++) face_nodes[node] = nodes[node];
    flip = REF_FALSE;
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1), "wf");
      if (REF_EMPTY == cell0) continue; /* this cell does not have the face */
      REIS(REF_EMPTY, cell1, "boundary quad with two cells");
      each_ref_cell_cell_face(ref_cell, face) {
        if (ref_cell_f2n(ref_cell, 0, face, cell0) ==
            ref_cell_f2n(ref_cell, 3, face, cell0))
          continue; /* skip tri faces */
        if ((nodes[0] == ref_cell_f2n(ref_cell, 3, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 2, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 0, face, cell0)) ||
            (nodes[0] == ref_cell_f2n(ref_cell, 2, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 3, face, cell0)) ||
            (nodes[0] == ref_cell_f2n(ref_cell, 1, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 3, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 2, face, cell0)) ||
            (nodes[0] == ref_cell_f2n(ref_cell, 0, face, cell0) &&
             nodes[1] == ref_cell_f2n(ref_cell, 3, face, cell0) &&
             nodes[2] == ref_cell_f2n(ref_cell, 2, face, cell0) &&
             nodes[3] == ref_cell_f2n(ref_cell, 1, face, cell0))) {
          RAS(!flip, "error, flip set twice");
          flip = REF_TRUE;
        }
      }
    }
    if (flip) {
      nodes[0] = face_nodes[3];
      nodes[1] = face_nodes[2];
      nodes[2] = face_nodes[1];
      nodes[3] = face_nodes[0];
      RSS(ref_cell_replace_whole(qua, cell, nodes), "replace with flip");
    }
  }

  return REF_SUCCESS;
}